

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<std::__cxx11::string>::append<std::move_iterator<std::__cxx11::string*>,void>
          (SmallVectorImpl<std::__cxx11::string> *this,
          move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          in_start,move_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                   in_end)

{
  pointer pcVar1;
  size_type sVar2;
  size_type *psVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  
  uVar4 = (long)in_end._M_current - (long)in_start._M_current >> 5;
  if ((ulong)*(uint *)(this + 0xc) - (ulong)*(uint *)(this + 8) < uVar4) {
    SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ::grow((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *)this,*(uint *)(this + 8) + uVar4);
  }
  if (in_start._M_current != in_end._M_current) {
    psVar3 = (size_type *)(*(long *)this + (ulong)*(uint *)(this + 8) * 0x20 + 0x10);
    paVar5 = &(in_start._M_current)->field_2;
    do {
      psVar3[-2] = (size_type)psVar3;
      pcVar1 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar5 + -1))
               ->_M_dataplus)._M_p;
      if (paVar5 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar1) {
        sVar2 = *(size_type *)((long)paVar5 + 8);
        *psVar3 = paVar5->_M_allocated_capacity;
        psVar3[1] = sVar2;
      }
      else {
        psVar3[-2] = (size_type)pcVar1;
        *psVar3 = paVar5->_M_allocated_capacity;
      }
      psVar3[-1] = *(size_type *)((long)paVar5 + -8);
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar5 + -1))->
      _M_dataplus)._M_p = (pointer)paVar5;
      *(size_type *)((long)paVar5 + -8) = 0;
      paVar5->_M_local_buf[0] = '\0';
      psVar3 = psVar3 + 4;
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar5 + 1);
      paVar5 = paVar5 + 2;
    } while (pbVar6 != in_end._M_current);
  }
  if (uVar4 + *(uint *)(this + 8) <= (ulong)*(uint *)(this + 0xc)) {
    *(int *)(this + 8) = (int)(uVar4 + *(uint *)(this + 8));
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }